

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall
spv::Builder::accessChainStore
          (Builder *this,Id rvalue,Decoration nonUniform,MemoryAccessMask memoryAccess,Scope scope,
          uint alignment)

{
  MemoryAccessMask MVar1;
  Id IVar2;
  uint uVar3;
  Id IVar4;
  StorageClass SVar5;
  Id typeId;
  size_type sVar6;
  ulong uVar7;
  reference pvVar8;
  MemoryAccessMask local_3c;
  Id tempBaseId;
  Id source_1;
  Id base_1;
  Id source;
  Id base;
  uint local_24;
  uint i;
  uint alignment_local;
  Scope scope_local;
  MemoryAccessMask memoryAccess_local;
  Decoration nonUniform_local;
  Id rvalue_local;
  Builder *this_local;
  
  local_24 = alignment;
  i = scope;
  alignment_local = memoryAccess;
  scope_local = nonUniform;
  memoryAccess_local = rvalue;
  _nonUniform_local = this;
  if (((this->accessChain).isRValue & 1U) != 0) {
    __assert_fail("accessChain.isRValue == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                  ,0xf87,
                  "void spv::Builder::accessChainStore(Id, Decoration, spv::MemoryAccessMask, spv::Scope, unsigned int)"
                 );
  }
  transferAccessChainSwizzle(this,true);
  sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    (&(this->accessChain).swizzle);
  if (sVar6 != 0) {
    IVar2 = getResultingAccessChainType(this);
    uVar3 = getNumTypeComponents(this,IVar2);
    sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      (&(this->accessChain).swizzle);
    if ((uVar3 != sVar6) && ((this->accessChain).component == 0)) {
      base = 0;
      while( true ) {
        uVar7 = (ulong)base;
        sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          (&(this->accessChain).swizzle);
        if (sVar6 <= uVar7) {
          return;
        }
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&(this->accessChain).swizzle,(ulong)base);
        source = makeUintConstant(this,*pvVar8,false);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&(this->accessChain).indexChain,&source);
        (this->accessChain).instr = 0;
        IVar2 = collapseAccessChain(this);
        addDecoration(this,IVar2,scope_local,-1);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
                  (&(this->accessChain).indexChain);
        MVar1 = memoryAccess_local;
        (this->accessChain).instr = 0;
        if ((this->accessChain).component != 0) break;
        IVar4 = getTypeId(this,memoryAccess_local);
        IVar4 = getContainedTypeId(this,IVar4);
        IVar4 = createCompositeExtract(this,MVar1,IVar4,base);
        local_24 = local_24 & (local_24 & local_24 - 1 ^ 0xffffffff);
        SVar5 = getStorageClass(this,IVar2);
        if (SVar5 == PhysicalStorageBuffer) {
          alignment_local = spv::operator|(alignment_local,Aligned);
        }
        createStore(this,IVar4,IVar2,alignment_local,i,local_24);
        base = base + 1;
      }
      __assert_fail("accessChain.component == NoResult",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                    ,0xf9a,
                    "void spv::Builder::accessChainStore(Id, Decoration, spv::MemoryAccessMask, spv::Scope, unsigned int)"
                   );
    }
  }
  IVar2 = collapseAccessChain(this);
  addDecoration(this,IVar2,scope_local,-1);
  MVar1 = memoryAccess_local;
  local_3c = memoryAccess_local;
  if ((this->accessChain).component == 0) {
    sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      (&(this->accessChain).swizzle);
    if (sVar6 != 0) {
      IVar4 = createLoad(this,IVar2,DecorationMax,MaskNone,Max,0);
      typeId = getTypeId(this,IVar4);
      local_3c = createLvalueSwizzle(this,typeId,IVar4,MVar1,&(this->accessChain).swizzle);
    }
    local_24 = local_24 & (local_24 & local_24 - 1 ^ 0xffffffff);
    SVar5 = getStorageClass(this,IVar2);
    if (SVar5 == PhysicalStorageBuffer) {
      alignment_local = spv::operator|(alignment_local,Aligned);
    }
    createStore(this,local_3c,IVar2,alignment_local,i,local_24);
    return;
  }
  __assert_fail("accessChain.component == NoResult",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                ,0xfae,
                "void spv::Builder::accessChainStore(Id, Decoration, spv::MemoryAccessMask, spv::Scope, unsigned int)"
               );
}

Assistant:

void Builder::accessChainStore(Id rvalue, Decoration nonUniform, spv::MemoryAccessMask memoryAccess, spv::Scope scope, unsigned int alignment)
{
    assert(accessChain.isRValue == false);

    transferAccessChainSwizzle(true);

    // If a swizzle exists and is not full and is not dynamic, then the swizzle will be broken into individual stores.
    if (accessChain.swizzle.size() > 0 &&
        getNumTypeComponents(getResultingAccessChainType()) != accessChain.swizzle.size() &&
        accessChain.component == NoResult) {
        for (unsigned int i = 0; i < accessChain.swizzle.size(); ++i) {
            accessChain.indexChain.push_back(makeUintConstant(accessChain.swizzle[i]));
            accessChain.instr = NoResult;

            Id base = collapseAccessChain();
            addDecoration(base, nonUniform);

            accessChain.indexChain.pop_back();
            accessChain.instr = NoResult;

            // dynamic component should be gone
            assert(accessChain.component == NoResult);

            Id source = createCompositeExtract(rvalue, getContainedTypeId(getTypeId(rvalue)), i);

            // take LSB of alignment
            alignment = alignment & ~(alignment & (alignment-1));
            if (getStorageClass(base) == StorageClassPhysicalStorageBufferEXT) {
                memoryAccess = (spv::MemoryAccessMask)(memoryAccess | spv::MemoryAccessAlignedMask);
            }

            createStore(source, base, memoryAccess, scope, alignment);
        }
    }
    else {
        Id base = collapseAccessChain();
        addDecoration(base, nonUniform);

        Id source = rvalue;

        // dynamic component should be gone
        assert(accessChain.component == NoResult);

        // If swizzle still exists, it may be out-of-order, we must load the target vector,
        // extract and insert elements to perform writeMask and/or swizzle.
        if (accessChain.swizzle.size() > 0) {
            Id tempBaseId = createLoad(base, spv::NoPrecision);
            source = createLvalueSwizzle(getTypeId(tempBaseId), tempBaseId, source, accessChain.swizzle);
        }

        // take LSB of alignment
        alignment = alignment & ~(alignment & (alignment-1));
        if (getStorageClass(base) == StorageClassPhysicalStorageBufferEXT) {
            memoryAccess = (spv::MemoryAccessMask)(memoryAccess | spv::MemoryAccessAlignedMask);
        }

        createStore(source, base, memoryAccess, scope, alignment);
    }
}